

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O0

KUINT8 __thiscall KDIS::PDU::Minefield_Data_PDU::calcPaddingPaintScheme(Minefield_Data_PDU *this)

{
  KBOOL KVar1;
  char local_11;
  KUINT8 ui8Pad;
  KUINT8 ui8NeedPadding;
  Minefield_Data_PDU *this_local;
  
  local_11 = '\x02';
  KVar1 = DATA_TYPE::MinefieldDataFilter::IsFusing(&this->m_DataFilter);
  if (KVar1) {
    local_11 = '\x04';
  }
  KVar1 = DATA_TYPE::MinefieldDataFilter::IsScalarDetectionCoefficient(&this->m_DataFilter);
  if (KVar1) {
    local_11 = local_11 + this->m_ui8NumSensTyp;
  }
  KVar1 = DATA_TYPE::MinefieldDataFilter::IsPaintScheme(&this->m_DataFilter);
  if (KVar1) {
    local_11 = local_11 + '\x01';
  }
  return (byte)(4 - this->m_ui8NumMines * local_11) % 4;
}

Assistant:

KUINT8 Minefield_Data_PDU::calcPaddingPaintScheme() const
{
    // Padding � 8{[4 � N(2 F(8) + M F(9) + F(10) + 2)] mod4} bits unused
    KUINT8 ui8NeedPadding = 2, ui8Pad = 0;
    if( m_DataFilter.IsFusing() )                       ui8NeedPadding += 2;
    if( m_DataFilter.IsScalarDetectionCoefficient() )   ui8NeedPadding += m_ui8NumSensTyp;
    if( m_DataFilter.IsPaintScheme() )                  ++ui8NeedPadding;
    ui8NeedPadding = 4 - ( m_ui8NumMines * ui8NeedPadding );
    return ui8NeedPadding % 4;
}